

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmhttpreq.h
# Opt level: O3

int __thiscall
vm_httpreq_cookie::clone
          (vm_httpreq_cookie *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  char *__s;
  int iVar1;
  undefined8 *puVar2;
  size_t len;
  __fn *__fn_00;
  char *pcVar3;
  undefined4 extraout_var;
  void *__child_stack_00;
  
  puVar2 = (undefined8 *)operator_new(0x18);
  pcVar3 = this->name;
  len = strlen(pcVar3);
  __s = this->val;
  if (__s == (char *)0x0) {
    __fn_00 = (__fn *)0x0;
  }
  else {
    __fn_00 = (__fn *)strlen(__s);
  }
  pcVar3 = lib_copy_str(pcVar3,len);
  *puVar2 = pcVar3;
  pcVar3 = lib_copy_str(__s,(size_t)__fn_00);
  puVar2[1] = pcVar3;
  puVar2[2] = 0;
  if (this->nxt != (vm_httpreq_cookie *)0x0) {
    iVar1 = clone(this->nxt,__fn_00,__child_stack_00,__flags,__arg);
    puVar2[2] = CONCAT44(extraout_var,iVar1);
  }
  return (int)puVar2;
}

Assistant:

vm_httpreq_cookie *clone()
    {
        /* clone myself */
        vm_httpreq_cookie *c = new vm_httpreq_cookie(
            name, strlen(name), val, val != 0 ? strlen(val) : 0);

        /* clone my list tail */
        if (nxt != 0)
            c->nxt = nxt->clone();

        /* return the clone */
        return c;
    }